

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O0

void __thiscall re2c::DFA::~DFA(DFA *this)

{
  State *this_00;
  Skeleton *this_01;
  State *s;
  DFA *this_local;
  
  while (this_00 = this->head, this_00 != (State *)0x0) {
    this->head = this_00->next;
    if (this_00 != (State *)0x0) {
      State::~State(this_00);
      operator_delete(this_00,0x58);
    }
  }
  this_01 = this->skeleton;
  if (this_01 != (Skeleton *)0x0) {
    Skeleton::~Skeleton(this_01);
    operator_delete(this_01,0x90);
  }
  std::__cxx11::string::~string((string *)&this->cond);
  std::__cxx11::string::~string((string *)&this->name);
  uniq_vector_t<const_re2c::State_*>::~uniq_vector_t(&this->accepts);
  return;
}

Assistant:

DFA::~DFA()
{
	State *s;

	while ((s = head))
	{
		head = s->next;
		delete s;
	}

	delete skeleton;
}